

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

void __thiscall
pybind11::cpp_function::initialize_generic
          (cpp_function *this,unique_function_record *unique_rec,char *text,type_info **types,
          size_t args)

{
  type_info *__rhs;
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
  *this_00;
  PyObject **ppPVar5;
  undefined8 uVar6;
  size_type sVar7;
  reference pvVar8;
  type_info *ptVar9;
  detail *this_01;
  pointer pfVar10;
  _func_void_void_ptr *destructor;
  PyObject *pPVar11;
  ulong uVar12;
  PyObject *pPVar13;
  PyTypeObject *type;
  char *text_00;
  char *typeid_name;
  char *local_818;
  PyTypeObject *local_788;
  bool local_731;
  char *local_708;
  PyCFunctionObject *func;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d0;
  PyObject *local_6b0;
  function_record *it;
  string local_6a0 [3];
  bool first_user_def;
  int index;
  string signatures;
  capsule local_678;
  capsule rec_capsule_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_668;
  str_attr_accessor local_648;
  str local_628;
  string local_620;
  allocator<char> local_5f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_598;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_578;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_558;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_538;
  str_attr_accessor local_518;
  object local_4f8;
  PyObject *local_4f0;
  str_attr_accessor local_4e8;
  object local_4c8;
  PyObject *local_4c0;
  handle local_4b8;
  object scope_module;
  handle local_4a8;
  capsule rec_capsule_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  handle local_438;
  capsule local_430;
  capsule rec_capsule;
  PyObject *self;
  function_record *chain_start;
  function_record *chain;
  string local_400;
  string local_3e0;
  str_attr_accessor local_3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  str_attr_accessor local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  str_attr_accessor local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  str_attr_accessor local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  handle local_240;
  handle th;
  type_info *tinfo;
  type_info *t;
  string local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  char local_1b9;
  char *pcStack_1b8;
  char c;
  char *pc;
  ulong uStack_1a8;
  bool is_starred;
  size_t arg_index;
  size_t type_index;
  string signature;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  allocator<char> local_f1;
  undefined1 local_f0 [8];
  string func_name;
  string class_name;
  object local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  reference local_80;
  argument_record *a;
  iterator __end2;
  iterator __begin2;
  vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
  *__range2;
  undefined1 local_50 [8];
  strdup_guard guarded_strdup;
  function_record *rec;
  size_t args_local;
  type_info **types_local;
  char *text_local;
  unique_function_record *unique_rec_local;
  cpp_function *this_local;
  
  guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       &std::
        unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
        ::get(unique_rec)->name;
  strdup_guard::strdup_guard((strdup_guard *)local_50);
  if (*guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage == (char *)0x0) {
    local_708 = "";
  }
  else {
    local_708 = *guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
  }
  pcVar4 = strdup_guard::operator()((strdup_guard *)local_50,local_708);
  *guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
   super__Vector_impl_data._M_end_of_storage = pcVar4;
  if (guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage[1] != (char *)0x0) {
    pcVar4 = strdup_guard::operator()
                       ((strdup_guard *)local_50,
                        guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage[1]);
    guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage[1] = pcVar4;
  }
  this_00 = (vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
             *)(guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage + 3);
  __end2 = std::
           vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
           ::begin(this_00);
  a = (argument_record *)
      std::
      vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
      ::end(this_00);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<pybind11::detail::argument_record_*,_std::vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>_>
                                     *)&a), bVar2) {
    local_80 = __gnu_cxx::
               __normal_iterator<pybind11::detail::argument_record_*,_std::vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>_>
               ::operator*(&__end2);
    if (local_80->name != (char *)0x0) {
      pcVar4 = strdup_guard::operator()((strdup_guard *)local_50,local_80->name);
      local_80->name = pcVar4;
    }
    if (local_80->descr == (char *)0x0) {
      bVar2 = handle::operator_cast_to_bool(&local_80->value);
      if (bVar2) {
        repr((pybind11 *)&local_a8,(local_80->value).m_ptr);
        object::cast<std::__cxx11::string>(&local_a0,&local_a8);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        pcVar4 = strdup_guard::operator()((strdup_guard *)local_50,pcVar4);
        local_80->descr = pcVar4;
        std::__cxx11::string::~string((string *)&local_a0);
        str::~str((str *)&local_a8);
      }
    }
    else {
      pcVar4 = strdup_guard::operator()((strdup_guard *)local_50,local_80->descr);
      local_80->descr = pcVar4;
    }
    __gnu_cxx::
    __normal_iterator<pybind11::detail::argument_record_*,_std::vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>_>
    ::operator++(&__end2);
  }
  iVar3 = strcmp(*guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage,"__init__");
  local_731 = true;
  if (iVar3 != 0) {
    iVar3 = strcmp(*guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,"__setstate__");
    local_731 = iVar3 == 0;
  }
  *(ushort *)
   ((long)guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage + 0x59) =
       *(ushort *)
        ((long)guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + 0x59) & 0xfffe | (ushort)local_731;
  if (((*(ushort *)
         ((long)guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage + 0x59) & 1) != 0) &&
     ((*(ushort *)
        ((long)guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + 0x59) >> 1 & 1) == 0)) {
    ppPVar5 = handle::ptr((handle *)
                          (guarded_strdup.strings.
                           super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + 0xe));
    detail::get_fully_qualified_tp_name_abi_cxx11_
              ((string *)((long)&func_name.field_2 + 8),(detail *)*ppPVar5,type);
    pcVar4 = *guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_f0,pcVar4,&local_f1);
    std::allocator<char>::~allocator(&local_f1);
    uVar1 = _PyExc_FutureWarning;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&signature.field_2 + 8),"pybind11-bound class \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&func_name.field_2 + 8));
    std::operator+(&local_158,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&signature.field_2 + 8),"\' is using an old-style placement-new \'");
    std::operator+(&local_138,&local_158,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0);
    std::operator+(&local_118,&local_138,
                   "\' which has been deprecated. See the upgrade guide in pybind11\'s docs. This message is only visible when compiled in debug mode."
                  );
    uVar6 = std::__cxx11::string::c_str();
    PyErr_WarnEx(uVar1,uVar6,0);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)(signature.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_f0);
    std::__cxx11::string::~string((string *)(func_name.field_2._M_local_buf + 8));
  }
  std::__cxx11::string::string((string *)&type_index);
  arg_index = 0;
  uStack_1a8 = 0;
  pc._7_1_ = 0;
  for (pcStack_1b8 = text; uVar12 = uStack_1a8, *pcStack_1b8 != '\0'; pcStack_1b8 = pcStack_1b8 + 1)
  {
    local_1b9 = *pcStack_1b8;
    if (local_1b9 == '{') {
      pc._7_1_ = pcStack_1b8[1] == '*';
      if (!(bool)pc._7_1_) {
        if (((*(ushort *)
               ((long)guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage + 0x59) >> 6 & 1) == 0) &&
           (uStack_1a8 ==
            *(ushort *)
             ((long)guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage + 0x5e))) {
          std::__cxx11::string::operator+=((string *)&type_index,"*, ");
        }
        uVar12 = uStack_1a8;
        sVar7 = std::
                vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                ::size((vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                        *)(guarded_strdup.strings.
                           super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + 3));
        if ((uVar12 < sVar7) &&
           (pvVar8 = std::
                     vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                     ::operator[]((vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                                   *)(guarded_strdup.strings.
                                      super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage + 3),uStack_1a8),
           pvVar8->name != (char *)0x0)) {
          pvVar8 = std::
                   vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                   ::operator[]((vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                                 *)(guarded_strdup.strings.
                                    super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage + 3),uStack_1a8);
          std::__cxx11::string::operator+=((string *)&type_index,pvVar8->name);
        }
        else if ((uStack_1a8 == 0) &&
                ((*(ushort *)
                   ((long)guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 0x59) >> 4 & 1) != 0)
                ) {
          std::__cxx11::string::operator+=((string *)&type_index,"self");
        }
        else {
          std::__cxx11::to_string
                    (&local_200,
                     uStack_1a8 -
                     ((*(ushort *)
                        ((long)guarded_strdup.strings.
                               super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage + 0x59) >> 4 & 1) != 0));
          std::operator+(&local_1e0,"arg",&local_200);
          std::__cxx11::string::operator+=((string *)&type_index,(string *)&local_1e0);
          std::__cxx11::string::~string((string *)&local_1e0);
          std::__cxx11::string::~string((string *)&local_200);
        }
        std::__cxx11::string::operator+=((string *)&type_index,": ");
      }
    }
    else if (local_1b9 == '}') {
      if ((((pc._7_1_ & 1) == 0) &&
          (sVar7 = std::
                   vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                   ::size((vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                           *)(guarded_strdup.strings.
                              super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage + 3)), uVar12 < sVar7)) &&
         (pvVar8 = std::
                   vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                   ::operator[]((vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                                 *)(guarded_strdup.strings.
                                    super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage + 3),uStack_1a8),
         pvVar8->descr != (char *)0x0)) {
        std::__cxx11::string::operator+=((string *)&type_index," = ");
        pvVar8 = std::
                 vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                 ::operator[]((vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                               *)(guarded_strdup.strings.
                                  super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage + 3),uStack_1a8);
        detail::replace_newlines_and_squash_abi_cxx11_((string *)&t,(detail *)pvVar8->descr,text_00)
        ;
        std::__cxx11::string::operator+=((string *)&type_index,(string *)&t);
        std::__cxx11::string::~string((string *)&t);
      }
      if ((*(short *)(guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage + 0xc) != 0) &&
         (uStack_1a8 + 1 ==
          (ulong)*(ushort *)
                  (guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 0xc))) {
        std::__cxx11::string::operator+=((string *)&type_index,", /");
      }
      if ((pc._7_1_ & 1) == 0) {
        uStack_1a8 = uStack_1a8 + 1;
      }
    }
    else if (local_1b9 == '%') {
      __rhs = types[arg_index];
      if (__rhs == (type_info *)0x0) {
        arg_index = arg_index + 1;
        pybind11_fail("Internal error while parsing type signature (1)");
      }
      arg_index = arg_index + 1;
      std::type_index::type_index((type_index *)&th,__rhs);
      ptVar9 = detail::get_type_info((type_index *)&th,false);
      if (ptVar9 == (type_info *)0x0) {
        if (((*(ushort *)
               ((long)guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage + 0x59) >> 1 & 1) == 0) ||
           (uStack_1a8 != 0)) {
          this_01 = (detail *)std::type_info::name(__rhs);
          detail::clean_type_id_abi_cxx11_(&local_400,this_01,typeid_name);
          detail::quote_cpp_type_name(&local_3e0,&local_400);
          std::__cxx11::string::operator+=((string *)&type_index,(string *)&local_3e0);
          std::__cxx11::string::~string((string *)&local_3e0);
          std::__cxx11::string::~string((string *)&local_400);
        }
        else {
          detail::object_api<pybind11::handle>::attr
                    (&local_380,
                     (object_api<pybind11::handle> *)
                     (guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage + 0xe),"__module__");
          detail::accessor<pybind11::detail::accessor_policies::str_attr>::
          cast<std::__cxx11::string>(&local_360,&local_380);
          std::operator+(&local_340,&local_360,".");
          detail::object_api<pybind11::handle>::attr
                    (&local_3c0,
                     (object_api<pybind11::handle> *)
                     (guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage + 0xe),"__qualname__");
          detail::accessor<pybind11::detail::accessor_policies::str_attr>::
          cast<std::__cxx11::string>(&local_3a0,&local_3c0);
          std::operator+(&local_320,&local_340,&local_3a0);
          std::__cxx11::string::operator+=((string *)&type_index,(string *)&local_320);
          std::__cxx11::string::~string((string *)&local_320);
          std::__cxx11::string::~string((string *)&local_3a0);
          detail::accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_3c0);
          std::__cxx11::string::~string((string *)&local_340);
          std::__cxx11::string::~string((string *)&local_360);
          detail::accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_380);
        }
      }
      else {
        handle::handle<_object_*,_0>(&local_240,(_object *)ptVar9->type);
        detail::object_api<pybind11::handle>::attr
                  (&local_2c0,(object_api<pybind11::handle> *)&local_240,"__module__");
        detail::accessor<pybind11::detail::accessor_policies::str_attr>::cast<std::__cxx11::string>
                  (&local_2a0,&local_2c0);
        std::operator+(&local_280,&local_2a0,".");
        detail::object_api<pybind11::handle>::attr
                  (&local_300,(object_api<pybind11::handle> *)&local_240,"__qualname__");
        detail::accessor<pybind11::detail::accessor_policies::str_attr>::cast<std::__cxx11::string>
                  (&local_2e0,&local_300);
        std::operator+(&local_260,&local_280,&local_2e0);
        std::__cxx11::string::operator+=((string *)&type_index,(string *)&local_260);
        std::__cxx11::string::~string((string *)&local_260);
        std::__cxx11::string::~string((string *)&local_2e0);
        detail::accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_300);
        std::__cxx11::string::~string((string *)&local_280);
        std::__cxx11::string::~string((string *)&local_2a0);
        detail::accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_2c0);
      }
    }
    else {
      std::__cxx11::string::operator+=((string *)&type_index,local_1b9);
    }
  }
  if ((uStack_1a8 ==
       (args - ((byte)(*(ushort *)
                        ((long)guarded_strdup.strings.
                               super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage + 0x59) >> 6) & 1)) -
       (ulong)((byte)(*(ushort *)
                       ((long)guarded_strdup.strings.
                              super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage + 0x59) >> 7) & 1)) &&
     (types[arg_index] == (type_info *)0x0)) {
    pcVar4 = (char *)std::__cxx11::string::c_str();
    pcVar4 = strdup_guard::operator()((strdup_guard *)local_50,pcVar4);
    guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage[2] = pcVar4;
    std::
    vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>::
    shrink_to_fit((vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                   *)(guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage + 3));
    *(short *)((long)guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 0x5c) = (short)args;
    bVar2 = handle::operator_cast_to_bool
                      ((handle *)
                       (guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage + 0xf));
    if (bVar2) {
      ppPVar5 = handle::ptr((handle *)
                            (guarded_strdup.strings.
                             super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage + 0xf));
      iVar3 = _Py_IS_TYPE(*ppPVar5,(PyTypeObject *)&PyInstanceMethod_Type);
      if (iVar3 != 0) {
        ppPVar5 = handle::ptr((handle *)
                              (guarded_strdup.strings.
                               super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage + 0xf));
        handle::handle<_object_*,_0>((handle *)&chain,(_object *)(*ppPVar5)[1].ob_refcnt);
        guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage[0xf] = (char *)chain;
      }
    }
    chain_start = (function_record *)0x0;
    self = (PyObject *)
           guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
    bVar2 = handle::operator_cast_to_bool
                      ((handle *)
                       (guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage + 0xf));
    if (bVar2) {
      ppPVar5 = handle::ptr((handle *)
                            (guarded_strdup.strings.
                             super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage + 0xf));
      iVar3 = _PyObject_TypeCheck(*ppPVar5,(PyTypeObject *)&PyCFunction_Type);
      if (iVar3 == 0) {
        bVar2 = detail::object_api<pybind11::handle>::is_none
                          ((object_api<pybind11::handle> *)
                           (guarded_strdup.strings.
                            super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 0xf));
        if ((!bVar2) &&
           (**guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage != '_')) {
          pcVar4 = *guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_498,pcVar4,
                     (allocator<char> *)((long)&rec_capsule_1.super_object.super_handle.m_ptr + 7));
          std::operator+(&local_478,"Cannot overload existing non-function object \"",&local_498);
          std::operator+(&local_458,&local_478,"\" with a function of the same name");
          pybind11_fail(&local_458);
        }
      }
      else {
        ppPVar5 = handle::ptr((handle *)
                              (guarded_strdup.strings.
                               super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage + 0xf));
        if ((*(uint *)((*ppPVar5)[1].ob_refcnt + 0x10) & 0x20) == 0) {
          ppPVar5 = handle::ptr((handle *)
                                (guarded_strdup.strings.
                                 super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage + 0xf));
          local_788 = (*ppPVar5)[1].ob_type;
        }
        else {
          local_788 = (PyTypeObject *)0x0;
        }
        handle::handle<_object_*,_0>((handle *)&rec_capsule,(_object *)local_788);
        bVar2 = isinstance<pybind11::capsule,_0>
                          ((handle)rec_capsule.super_object.super_handle.m_ptr);
        if (bVar2) {
          handle::handle<_object_*,_0>(&local_438,(_object *)local_788);
          reinterpret_borrow<pybind11::capsule>((pybind11 *)&local_430,local_438);
          bVar2 = detail::is_function_record_capsule(&local_430);
          if (bVar2) {
            chain_start = capsule::get_pointer<pybind11::detail::function_record>(&local_430);
            bVar2 = detail::object_api<pybind11::handle>::is
                              ((object_api<pybind11::handle> *)&chain_start->scope,
                               (object_api<pybind11::handle> *)
                               (guarded_strdup.strings.
                                super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage + 0xe));
            if (!bVar2) {
              chain_start = (function_record *)0x0;
            }
          }
          else {
            chain_start = (function_record *)0x0;
          }
          capsule::~capsule(&local_430);
        }
        else {
          chain_start = (function_record *)0x0;
        }
      }
    }
    if (chain_start == (function_record *)0x0) {
      pcVar4 = (char *)operator_new(0x20);
      pcVar4[0x10] = '\0';
      pcVar4[0x11] = '\0';
      pcVar4[0x12] = '\0';
      pcVar4[0x13] = '\0';
      pcVar4[0x14] = '\0';
      pcVar4[0x15] = '\0';
      pcVar4[0x16] = '\0';
      pcVar4[0x17] = '\0';
      pcVar4[0x18] = '\0';
      pcVar4[0x19] = '\0';
      pcVar4[0x1a] = '\0';
      pcVar4[0x1b] = '\0';
      pcVar4[0x1c] = '\0';
      pcVar4[0x1d] = '\0';
      pcVar4[0x1e] = '\0';
      pcVar4[0x1f] = '\0';
      pcVar4[0] = '\0';
      pcVar4[1] = '\0';
      pcVar4[2] = '\0';
      pcVar4[3] = '\0';
      pcVar4[4] = '\0';
      pcVar4[5] = '\0';
      pcVar4[6] = '\0';
      pcVar4[7] = '\0';
      pcVar4[8] = '\0';
      pcVar4[9] = '\0';
      pcVar4[10] = '\0';
      pcVar4[0xb] = '\0';
      pcVar4[0xc] = '\0';
      pcVar4[0xd] = '\0';
      pcVar4[0xe] = '\0';
      pcVar4[0xf] = '\0';
      guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage[0xd] = pcVar4;
      pcVar4 = guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage[0xd];
      pcVar4[0x10] = '\0';
      pcVar4[0x11] = '\0';
      pcVar4[0x12] = '\0';
      pcVar4[0x13] = '\0';
      pcVar4[0x14] = '\0';
      pcVar4[0x15] = '\0';
      pcVar4[0x16] = '\0';
      pcVar4[0x17] = '\0';
      pcVar4[0x18] = '\0';
      pcVar4[0x19] = '\0';
      pcVar4[0x1a] = '\0';
      pcVar4[0x1b] = '\0';
      pcVar4[0x1c] = '\0';
      pcVar4[0x1d] = '\0';
      pcVar4[0x1e] = '\0';
      pcVar4[0x1f] = '\0';
      pcVar4[0] = '\0';
      pcVar4[1] = '\0';
      pcVar4[2] = '\0';
      pcVar4[3] = '\0';
      pcVar4[4] = '\0';
      pcVar4[5] = '\0';
      pcVar4[6] = '\0';
      pcVar4[7] = '\0';
      pcVar4[8] = '\0';
      pcVar4[9] = '\0';
      pcVar4[10] = '\0';
      pcVar4[0xb] = '\0';
      pcVar4[0xc] = '\0';
      pcVar4[0xd] = '\0';
      pcVar4[0xe] = '\0';
      pcVar4[0xf] = '\0';
      *(char **)guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage[0xd] =
           *guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
      *(code **)(guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage[0xd] + 8) = dispatcher;
      pcVar4 = guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage[0xd];
      pcVar4[0x10] = '\x03';
      pcVar4[0x11] = '\0';
      pcVar4[0x12] = '\0';
      pcVar4[0x13] = '\0';
      pfVar10 = std::
                unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                ::release(unique_rec);
      pcVar4 = detail::get_function_record_capsule_name();
      destructor = initialize_generic(std::unique_ptr&&,char_const*,std::type_info_const*const*,unsigned_long)
                   ::{lambda(void*)#1}::operator_cast_to_function_pointer
                             ((_lambda_void___1_ *)((long)&scope_module.super_handle.m_ptr + 7));
      capsule::capsule((capsule *)&local_4a8,pfVar10,pcVar4,destructor);
      strdup_guard::release((strdup_guard *)local_50);
      object::object((object *)&local_4b8);
      bVar2 = handle::operator_cast_to_bool
                        ((handle *)
                         (guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 0xe));
      if (bVar2) {
        local_4c0 = (PyObject *)
                    guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage[0xe];
        bVar2 = hasattr((handle)local_4c0,"__module__");
        if (bVar2) {
          detail::object_api<pybind11::handle>::attr
                    (&local_4e8,
                     (object_api<pybind11::handle> *)
                     (guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage + 0xe),"__module__");
          detail::accessor::operator_cast_to_object((accessor *)&local_4c8);
          object::operator=((object *)&local_4b8,&local_4c8);
          object::~object(&local_4c8);
          detail::accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_4e8);
        }
        else {
          local_4f0 = (PyObject *)
                      guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage[0xe];
          bVar2 = hasattr((handle)local_4f0,"__name__");
          if (bVar2) {
            detail::object_api<pybind11::handle>::attr
                      (&local_518,
                       (object_api<pybind11::handle> *)
                       (guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage + 0xe),"__name__");
            detail::accessor::operator_cast_to_object((accessor *)&local_4f8);
            object::operator=((object *)&local_4b8,&local_4f8);
            object::~object(&local_4f8);
            detail::accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_518);
          }
        }
      }
      pcVar4 = guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage[0xd];
      ppPVar5 = handle::ptr(&local_4a8);
      pPVar11 = *ppPVar5;
      ppPVar5 = handle::ptr(&local_4b8);
      pPVar11 = (PyObject *)PyCMethod_New(pcVar4,pPVar11,*ppPVar5,0);
      (this->super_function).super_object.super_handle.m_ptr = pPVar11;
      if ((this->super_function).super_object.super_handle.m_ptr == (PyObject *)0x0) {
        pybind11_fail("cpp_function::cpp_function(): Could not allocate function object");
      }
      object::~object((object *)&local_4b8);
      capsule::~capsule((capsule *)&local_4a8);
    }
    else {
      ppPVar5 = handle::ptr((handle *)
                            (guarded_strdup.strings.
                             super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage + 0xf));
      (this->super_function).super_object.super_handle.m_ptr = *ppPVar5;
      handle::inc_ref((handle *)this);
      if (((byte)(*(ushort *)&chain_start->field_0x59 >> 4) & 1) !=
          ((byte)(*(ushort *)
                   ((long)guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 0x59) >> 4) & 1)) {
        pcVar4 = "static";
        if ((*(byte *)((long)guarded_strdup.strings.
                             super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage + 0x59) >> 4 & 1) != 0) {
          pcVar4 = "instance";
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_5f8,pcVar4,&local_5f9);
        std::operator+(&local_5d8,
                       "overloading a method with both static and instance methods is not supported; error while attempting to bind "
                       ,&local_5f8);
        std::operator+(&local_5b8,&local_5d8," method ");
        detail::object_api<pybind11::handle>::attr
                  (&local_648,
                   (object_api<pybind11::handle> *)
                   (guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage + 0xe),"__name__");
        str::str<pybind11::detail::accessor_policies::str_attr>(&local_628,&local_648);
        str::operator_cast_to_string(&local_620,&local_628);
        std::operator+(&local_598,&local_5b8,&local_620);
        std::operator+(&local_578,&local_598,".");
        pcVar4 = *guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_668,pcVar4,
                   (allocator<char> *)((long)&rec_capsule_2.super_object.super_handle.m_ptr + 7));
        std::operator+(&local_558,&local_578,&local_668);
        std::operator+(&local_538,&local_558,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &type_index);
        pybind11_fail(&local_538);
      }
      if ((*(ushort *)
            ((long)guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 0x59) >> 8 & 1) == 0) {
        self = (PyObject *)chain_start;
        for (; chain_start->next != (function_record *)0x0; chain_start = chain_start->next) {
        }
        pfVar10 = std::
                  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                  ::release(unique_rec);
        chain_start->next = pfVar10;
        strdup_guard::release((strdup_guard *)local_50);
      }
      else {
        self = (PyObject *)
               guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
        guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage[0x10] = (char *)chain_start;
        handle::handle<_object_*,_0>
                  ((handle *)((long)&signatures.field_2 + 8),
                   (_object *)(this->super_function).super_object.super_handle.m_ptr[1].ob_type);
        reinterpret_borrow<pybind11::capsule>
                  ((pybind11 *)&local_678,(handle)signatures.field_2._8_8_);
        pfVar10 = std::
                  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                  ::release(unique_rec);
        capsule::set_pointer(&local_678,pfVar10);
        strdup_guard::release((strdup_guard *)local_50);
        capsule::~capsule(&local_678);
      }
    }
    std::__cxx11::string::string(local_6a0);
    it._4_4_ = 0;
    if ((chain_start != (function_record *)0x0) &&
       (bVar2 = options::show_function_signatures(), bVar2)) {
      std::__cxx11::string::operator+=
                (local_6a0,
                 *guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::operator+=(local_6a0,"(*args, **kwargs)\n");
      std::__cxx11::string::operator+=(local_6a0,"Overloaded function.\n\n");
    }
    it._3_1_ = 1;
    for (local_6b0 = self; local_6b0 != (PyObject *)0x0;
        local_6b0 = (PyObject *)local_6b0[8].ob_refcnt) {
      bVar2 = options::show_function_signatures();
      if (bVar2) {
        if (0 < it._4_4_) {
          std::__cxx11::string::operator+=(local_6a0,'\n');
        }
        if (chain_start != (function_record *)0x0) {
          it._4_4_ = it._4_4_ + 1;
          std::__cxx11::to_string((string *)&func,it._4_4_);
          std::operator+(&local_6d0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&func,
                         ". ");
          std::__cxx11::string::operator+=(local_6a0,(string *)&local_6d0);
          std::__cxx11::string::~string((string *)&local_6d0);
          std::__cxx11::string::~string((string *)&func);
        }
        std::__cxx11::string::operator+=
                  (local_6a0,
                   *guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::operator+=(local_6a0,(char *)local_6b0[1].ob_refcnt);
        std::__cxx11::string::operator+=(local_6a0,'\n');
      }
      if (((local_6b0->ob_type != (PyTypeObject *)0x0) &&
          ((char)(local_6b0->ob_type->ob_base).ob_base.ob_refcnt != '\0')) &&
         (bVar2 = options::show_user_defined_docstrings(), bVar2)) {
        bVar2 = options::show_function_signatures();
        if (!bVar2) {
          if ((it._3_1_ & 1) == 0) {
            std::__cxx11::string::operator+=(local_6a0,'\n');
          }
          else {
            it._3_1_ = 0;
          }
        }
        bVar2 = options::show_function_signatures();
        if (bVar2) {
          std::__cxx11::string::operator+=(local_6a0,'\n');
        }
        std::__cxx11::string::operator+=(local_6a0,(char *)local_6b0->ob_type);
        bVar2 = options::show_function_signatures();
        if (bVar2) {
          std::__cxx11::string::operator+=(local_6a0,'\n');
        }
      }
    }
    pPVar11 = (this->super_function).super_object.super_handle.m_ptr;
    free(*(void **)(pPVar11[1].ob_refcnt + 0x18));
    uVar12 = std::__cxx11::string::empty();
    if ((uVar12 & 1) == 0) {
      pcVar4 = (char *)std::__cxx11::string::c_str();
      local_818 = strdup(pcVar4);
    }
    else {
      local_818 = (char *)0x0;
    }
    *(char **)(pPVar11[1].ob_refcnt + 0x18) = local_818;
    if ((*(ushort *)
          ((long)guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 0x59) >> 4 & 1) != 0) {
      pPVar13 = (PyObject *)
                PyInstanceMethod_New((this->super_function).super_object.super_handle.m_ptr);
      (this->super_function).super_object.super_handle.m_ptr = pPVar13;
      if ((this->super_function).super_object.super_handle.m_ptr == (PyObject *)0x0) {
        pybind11_fail("cpp_function::cpp_function(): Could not allocate instance method object");
      }
      _Py_DECREF(pPVar11);
    }
    std::__cxx11::string::~string(local_6a0);
    std::__cxx11::string::~string((string *)&type_index);
    strdup_guard::~strdup_guard((strdup_guard *)local_50);
    return;
  }
  pybind11_fail("Internal error while parsing type signature (2)");
}

Assistant:

void initialize_generic(unique_function_record &&unique_rec,
                            const char *text,
                            const std::type_info *const *types,
                            size_t args) {
        // Do NOT receive `unique_rec` by value. If this function fails to move out the unique_ptr,
        // we do not want this to destruct the pointer. `initialize` (the caller) still relies on
        // the pointee being alive after this call. Only move out if a `capsule` is going to keep
        // it alive.
        auto *rec = unique_rec.get();

        // Keep track of strdup'ed strings, and clean them up as long as the function's capsule
        // has not taken ownership yet (when `unique_rec.release()` is called).
        // Note: This cannot easily be fixed by a `unique_ptr` with custom deleter, because the
        // strings are only referenced before strdup'ing. So only *after* the following block could
        // `destruct` safely be called, but even then, `repr` could still throw in the middle of
        // copying all strings.
        strdup_guard guarded_strdup;

        /* Create copies of all referenced C-style strings */
        rec->name = guarded_strdup(rec->name ? rec->name : "");
        if (rec->doc) {
            rec->doc = guarded_strdup(rec->doc);
        }
        for (auto &a : rec->args) {
            if (a.name) {
                a.name = guarded_strdup(a.name);
            }
            if (a.descr) {
                a.descr = guarded_strdup(a.descr);
            } else if (a.value) {
                a.descr = guarded_strdup(repr(a.value).cast<std::string>().c_str());
            }
        }

        rec->is_constructor = (std::strcmp(rec->name, "__init__") == 0)
                              || (std::strcmp(rec->name, "__setstate__") == 0);

#if defined(PYBIND11_DETAILED_ERROR_MESSAGES) && !defined(PYBIND11_DISABLE_NEW_STYLE_INIT_WARNING)
        if (rec->is_constructor && !rec->is_new_style_constructor) {
            const auto class_name
                = detail::get_fully_qualified_tp_name((PyTypeObject *) rec->scope.ptr());
            const auto func_name = std::string(rec->name);
            PyErr_WarnEx(PyExc_FutureWarning,
                         ("pybind11-bound class '" + class_name
                          + "' is using an old-style "
                            "placement-new '"
                          + func_name
                          + "' which has been deprecated. See "
                            "the upgrade guide in pybind11's docs. This message is only visible "
                            "when compiled in debug mode.")
                             .c_str(),
                         0);
        }
#endif

        /* Generate a proper function signature */
        std::string signature;
        size_t type_index = 0, arg_index = 0;
        bool is_starred = false;
        for (const auto *pc = text; *pc != '\0'; ++pc) {
            const auto c = *pc;

            if (c == '{') {
                // Write arg name for everything except *args and **kwargs.
                is_starred = *(pc + 1) == '*';
                if (is_starred) {
                    continue;
                }
                // Separator for keyword-only arguments, placed before the kw
                // arguments start (unless we are already putting an *args)
                if (!rec->has_args && arg_index == rec->nargs_pos) {
                    signature += "*, ";
                }
                if (arg_index < rec->args.size() && rec->args[arg_index].name) {
                    signature += rec->args[arg_index].name;
                } else if (arg_index == 0 && rec->is_method) {
                    signature += "self";
                } else {
                    signature += "arg" + std::to_string(arg_index - (rec->is_method ? 1 : 0));
                }
                signature += ": ";
            } else if (c == '}') {
                // Write default value if available.
                if (!is_starred && arg_index < rec->args.size() && rec->args[arg_index].descr) {
                    signature += " = ";
                    signature += detail::replace_newlines_and_squash(rec->args[arg_index].descr);
                }
                // Separator for positional-only arguments (placed after the
                // argument, rather than before like *
                if (rec->nargs_pos_only > 0 && (arg_index + 1) == rec->nargs_pos_only) {
                    signature += ", /";
                }
                if (!is_starred) {
                    arg_index++;
                }
            } else if (c == '%') {
                const std::type_info *t = types[type_index++];
                if (!t) {
                    pybind11_fail("Internal error while parsing type signature (1)");
                }
                if (auto *tinfo = detail::get_type_info(*t)) {
                    handle th((PyObject *) tinfo->type);
                    signature += th.attr("__module__").cast<std::string>() + "."
                                 + th.attr("__qualname__").cast<std::string>();
                } else if (rec->is_new_style_constructor && arg_index == 0) {
                    // A new-style `__init__` takes `self` as `value_and_holder`.
                    // Rewrite it to the proper class type.
                    signature += rec->scope.attr("__module__").cast<std::string>() + "."
                                 + rec->scope.attr("__qualname__").cast<std::string>();
                } else {
                    signature += detail::quote_cpp_type_name(detail::clean_type_id(t->name()));
                }
            } else {
                signature += c;
            }
        }

        if (arg_index != args - rec->has_args - rec->has_kwargs || types[type_index] != nullptr) {
            pybind11_fail("Internal error while parsing type signature (2)");
        }

        rec->signature = guarded_strdup(signature.c_str());
        rec->args.shrink_to_fit();
        rec->nargs = (std::uint16_t) args;

        if (rec->sibling && PYBIND11_INSTANCE_METHOD_CHECK(rec->sibling.ptr())) {
            rec->sibling = PYBIND11_INSTANCE_METHOD_GET_FUNCTION(rec->sibling.ptr());
        }

        detail::function_record *chain = nullptr, *chain_start = rec;
        if (rec->sibling) {
            if (PyCFunction_Check(rec->sibling.ptr())) {
                auto *self = PyCFunction_GET_SELF(rec->sibling.ptr());
                if (!isinstance<capsule>(self)) {
                    chain = nullptr;
                } else {
                    auto rec_capsule = reinterpret_borrow<capsule>(self);
                    if (detail::is_function_record_capsule(rec_capsule)) {
                        chain = rec_capsule.get_pointer<detail::function_record>();
                        /* Never append a method to an overload chain of a parent class;
                           instead, hide the parent's overloads in this case */
                        if (!chain->scope.is(rec->scope)) {
                            chain = nullptr;
                        }
                    } else {
                        chain = nullptr;
                    }
                }
            }
            // Don't trigger for things like the default __init__, which are wrapper_descriptors
            // that we are intentionally replacing
            else if (!rec->sibling.is_none() && rec->name[0] != '_') {
                pybind11_fail("Cannot overload existing non-function object \""
                              + std::string(rec->name) + "\" with a function of the same name");
            }
        }

        if (!chain) {
            /* No existing overload was found, create a new function object */
            rec->def = new PyMethodDef();
            std::memset(rec->def, 0, sizeof(PyMethodDef));
            rec->def->ml_name = rec->name;
            rec->def->ml_meth
                = reinterpret_cast<PyCFunction>(reinterpret_cast<void (*)()>(dispatcher));
            rec->def->ml_flags = METH_VARARGS | METH_KEYWORDS;

            capsule rec_capsule(unique_rec.release(),
                                detail::get_function_record_capsule_name(),
                                [](void *ptr) { destruct((detail::function_record *) ptr); });
            guarded_strdup.release();

            object scope_module;
            if (rec->scope) {
                if (hasattr(rec->scope, "__module__")) {
                    scope_module = rec->scope.attr("__module__");
                } else if (hasattr(rec->scope, "__name__")) {
                    scope_module = rec->scope.attr("__name__");
                }
            }

            m_ptr = PyCFunction_NewEx(rec->def, rec_capsule.ptr(), scope_module.ptr());
            if (!m_ptr) {
                pybind11_fail("cpp_function::cpp_function(): Could not allocate function object");
            }
        } else {
            /* Append at the beginning or end of the overload chain */
            m_ptr = rec->sibling.ptr();
            inc_ref();
            if (chain->is_method != rec->is_method) {
                pybind11_fail(
                    "overloading a method with both static and instance methods is not supported; "
#if !defined(PYBIND11_DETAILED_ERROR_MESSAGES)
                    "#define PYBIND11_DETAILED_ERROR_MESSAGES or compile in debug mode for more "
                    "details"
#else
                    "error while attempting to bind "
                    + std::string(rec->is_method ? "instance" : "static") + " method "
                    + std::string(pybind11::str(rec->scope.attr("__name__"))) + "."
                    + std::string(rec->name) + signature
#endif
                );
            }

            if (rec->prepend) {
                // Beginning of chain; we need to replace the capsule's current head-of-the-chain
                // pointer with this one, then make this one point to the previous head of the
                // chain.
                chain_start = rec;
                rec->next = chain;
                auto rec_capsule
                    = reinterpret_borrow<capsule>(((PyCFunctionObject *) m_ptr)->m_self);
                rec_capsule.set_pointer(unique_rec.release());
                guarded_strdup.release();
            } else {
                // Or end of chain (normal behavior)
                chain_start = chain;
                while (chain->next) {
                    chain = chain->next;
                }
                chain->next = unique_rec.release();
                guarded_strdup.release();
            }
        }

        std::string signatures;
        int index = 0;
        /* Create a nice pydoc rec including all signatures and
           docstrings of the functions in the overload chain */
        if (chain && options::show_function_signatures()) {
            // First a generic signature
            signatures += rec->name;
            signatures += "(*args, **kwargs)\n";
            signatures += "Overloaded function.\n\n";
        }
        // Then specific overload signatures
        bool first_user_def = true;
        for (auto *it = chain_start; it != nullptr; it = it->next) {
            if (options::show_function_signatures()) {
                if (index > 0) {
                    signatures += '\n';
                }
                if (chain) {
                    signatures += std::to_string(++index) + ". ";
                }
                signatures += rec->name;
                signatures += it->signature;
                signatures += '\n';
            }
            if (it->doc && it->doc[0] != '\0' && options::show_user_defined_docstrings()) {
                // If we're appending another docstring, and aren't printing function signatures,
                // we need to append a newline first:
                if (!options::show_function_signatures()) {
                    if (first_user_def) {
                        first_user_def = false;
                    } else {
                        signatures += '\n';
                    }
                }
                if (options::show_function_signatures()) {
                    signatures += '\n';
                }
                signatures += it->doc;
                if (options::show_function_signatures()) {
                    signatures += '\n';
                }
            }
        }

        /* Install docstring */
        auto *func = (PyCFunctionObject *) m_ptr;
        std::free(const_cast<char *>(func->m_ml->ml_doc));
        // Install docstring if it's non-empty (when at least one option is enabled)
        func->m_ml->ml_doc
            = signatures.empty() ? nullptr : PYBIND11_COMPAT_STRDUP(signatures.c_str());

        if (rec->is_method) {
            m_ptr = PYBIND11_INSTANCE_METHOD_NEW(m_ptr, rec->scope.ptr());
            if (!m_ptr) {
                pybind11_fail(
                    "cpp_function::cpp_function(): Could not allocate instance method object");
            }
            Py_DECREF(func);
        }
    }